

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipe.c
# Opt level: O0

int nn_pipe_send(nn_pipe *self,nn_msg *msg)

{
  FILE *__stream;
  char *pcVar1;
  nn_pipebase *pipebase;
  int rc;
  nn_msg *msg_local;
  nn_pipe *self_local;
  
  if (self[0x62] != (nn_pipe)0x1) {
    nn_backtrace_print();
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n",
            "pipebase->outstate == NN_PIPEBASE_OUTSTATE_IDLE",
            "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/src/core/pipe.c",
            0xb7);
    fflush(_stderr);
    nn_err_abort();
  }
  self[0x62] = (nn_pipe)0x2;
  self_local._4_4_ = (*(code *)**(undefined8 **)(self + 0x58))(self,msg);
  if ((int)self_local._4_4_ < 0) {
    nn_backtrace_print();
    __stream = _stderr;
    pcVar1 = nn_err_strerror(-self_local._4_4_);
    fprintf(__stream,"%s [%d] (%s:%d)\n",pcVar1,(ulong)-self_local._4_4_,
            "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/src/core/pipe.c",
            0xba);
    fflush(_stderr);
    nn_err_abort();
  }
  if (self[0x62] == (nn_pipe)0x3) {
    self[0x62] = (nn_pipe)0x1;
  }
  else {
    if (self[0x62] != (nn_pipe)0x2) {
      nn_backtrace_print();
      fprintf(_stderr,"Assertion failed: %s (%s:%d)\n",
              "pipebase->outstate == NN_PIPEBASE_OUTSTATE_SENDING",
              "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/src/core/pipe.c",
              0xbf);
      fflush(_stderr);
      nn_err_abort();
    }
    self[0x62] = (nn_pipe)0x4;
    self_local._4_4_ = self_local._4_4_ | 1;
  }
  return self_local._4_4_;
}

Assistant:

int nn_pipe_send (struct nn_pipe *self, struct nn_msg *msg)
{
    int rc;
    struct nn_pipebase *pipebase;

    pipebase = (struct nn_pipebase*) self;
    nn_assert (pipebase->outstate == NN_PIPEBASE_OUTSTATE_IDLE);
    pipebase->outstate = NN_PIPEBASE_OUTSTATE_SENDING;
    rc = pipebase->vfptr->send (pipebase, msg);
    errnum_assert (rc >= 0, -rc);
    if (nn_fast (pipebase->outstate == NN_PIPEBASE_OUTSTATE_SENT)) {
        pipebase->outstate = NN_PIPEBASE_OUTSTATE_IDLE;
        return rc;
    }
    nn_assert (pipebase->outstate == NN_PIPEBASE_OUTSTATE_SENDING);
    pipebase->outstate = NN_PIPEBASE_OUTSTATE_ASYNC;
    return rc | NN_PIPEBASE_RELEASE;
}